

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void WriteCompactSize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *os,uint64_t nSize
               )

{
  size_t in_RCX;
  size_t len;
  int __fd;
  HashedSourceWriter<AutoFile> *pHVar1;
  long in_FS_OFFSET;
  uint64_t local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (nSize < 0xfd) {
    local_30 = CONCAT71(local_30._1_7_,(char)nSize);
    pHVar1 = os->m_substream;
    AutoFile::write(pHVar1->m_source,(int)&local_30,(void *)0x1,in_RCX);
    len = 1;
  }
  else if (nSize < 0x10000) {
    local_30 = CONCAT71(local_30._1_7_,0xfd);
    pHVar1 = os->m_substream;
    AutoFile::write(pHVar1->m_source,(int)&local_30,(void *)0x1,in_RCX);
    CSHA256::Write((CSHA256 *)pHVar1,(uchar *)&local_30,1);
    local_30 = CONCAT62(local_30._2_6_,(short)nSize);
    pHVar1 = os->m_substream;
    AutoFile::write(pHVar1->m_source,(int)&local_30,(void *)0x2,in_RCX);
    len = 2;
  }
  else {
    __fd = (int)&local_30;
    if (nSize >> 0x20 == 0) {
      local_30 = CONCAT71(local_30._1_7_,0xfe);
      pHVar1 = os->m_substream;
      AutoFile::write(pHVar1->m_source,__fd,(void *)0x1,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,(uchar *)&local_30,1);
      local_30 = CONCAT44(local_30._4_4_,(int)nSize);
      pHVar1 = os->m_substream;
      AutoFile::write(pHVar1->m_source,(int)&local_30,(void *)0x4,in_RCX);
      len = 4;
    }
    else {
      local_30 = CONCAT71(local_30._1_7_,0xff);
      pHVar1 = os->m_substream;
      AutoFile::write(pHVar1->m_source,__fd,(void *)0x1,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,(uchar *)&local_30,1);
      pHVar1 = os->m_substream;
      local_30 = nSize;
      AutoFile::write(pHVar1->m_source,(int)&local_30,&DAT_00000008,in_RCX);
      len = 8;
    }
  }
  CSHA256::Write((CSHA256 *)pHVar1,(uchar *)&local_30,len);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}